

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executable.cpp
# Opt level: O2

bool fs_is_exe(string_view path)

{
  string_view path_00;
  bool bVar1;
  ulong uVar2;
  string_view fname;
  string_view path_local;
  error_code ec;
  path local_40;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  bVar1 = fs_is_file(path);
  if (bVar1) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_40,&path_local,auto_format);
    uVar2 = std::filesystem::status(&local_40,&ec);
    std::filesystem::__cxx11::path::~path(&local_40);
    if (ec._M_value == 0) {
      return (uVar2 & 0x4900000000) != 0;
    }
    path_00._M_str = path_local._M_str;
    path_00._M_len = path_local._M_len;
    fname._M_str = "fs_is_exe";
    fname._M_len = 9;
    fs_print_error(path_00,fname,&ec);
  }
  return false;
}

Assistant:

bool fs_is_exe(std::string_view path)
{
  // is path (file or symlink to a file) executable by the user
  // directories are not considered executable--use fs_get_permissions() for that.

  if(!fs_is_file(path))
    return false;

#if defined(_WIN32)
  std::string suffix = fs_suffix(path);
  if (suffix.empty())
    return fs_is_executable_binary(path);

  if(!fs_is_readable(path))
    return false;

  std::string pathext = fs_getenv("PATHEXT");
  if(pathext.empty())
    pathext = ".com;.exe;.bat;.cmd";
  else
    std::transform(pathext.begin(), pathext.end(), pathext.begin(), ::tolower);

  std::transform(suffix.begin(), suffix.end(), suffix.begin(), ::tolower);
  if(fs_trace) std::cout << "TRACE: is_exe(" << path << "):  suffix: " << suffix << " length " << suffix.length() << " pathext: " << pathext << "\n";

#if defined(__cpp_lib_string_contains) // C++23
  return pathext.contains(suffix);
#else
  return pathext.find(suffix) != std::string::npos;
#endif

#elif defined(HAVE_CXX_FILESYSTEM)

#if defined(__cpp_using_enum)  // C++20
  using enum std::filesystem::perms;
#else
  constexpr std::filesystem::perms none = std::filesystem::perms::none;
  constexpr std::filesystem::perms others_exec = std::filesystem::perms::others_exec;
  constexpr std::filesystem::perms group_exec = std::filesystem::perms::group_exec;
  constexpr std::filesystem::perms owner_exec = std::filesystem::perms::owner_exec;
#endif

  std::error_code ec;
  const auto s = std::filesystem::status(path, ec);
  if(ec){
    fs_print_error(path, __func__, ec);
    return false;
  }

  return (s.permissions() & (owner_exec | group_exec | others_exec)) != none;

#else
  return access(path.data(), X_OK) == 0;
#endif
}